

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O1

void av1_svc_update_buffer_slot_refreshed(AV1_COMP *cpi)

{
  uint uVar1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  uint *puVar4;
  uint i;
  long lVar5;
  
  pAVar3 = cpi->ppi;
  puVar4 = &(cpi->svc).current_superframe;
  if (pAVar3->use_svc == 0) {
    puVar4 = &(cpi->common).current_frame.frame_number;
  }
  uVar1 = *puVar4;
  if ((cpi->common).current_frame.frame_type == '\0') {
    lVar5 = -8;
    do {
      *(uint *)((pAVar3->rtc_ref).buffer_spatial_layer + lVar5 * 4) = uVar1;
      (pAVar3->rtc_ref).buffer_spatial_layer[lVar5 + 8] = (uchar)(cpi->svc).spatial_layer_id;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0);
  }
  else if ((pAVar3->rtc_ref).set_ref_frame_config != 0) {
    lVar5 = 0;
    do {
      iVar2 = (pAVar3->rtc_ref).ref_idx[lVar5];
      if ((pAVar3->rtc_ref).refresh[iVar2] != 0) {
        (pAVar3->rtc_ref).buffer_time_index[iVar2] = uVar1;
        (pAVar3->rtc_ref).buffer_spatial_layer[iVar2] = (uchar)(cpi->svc).spatial_layer_id;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 7);
  }
  return;
}

Assistant:

void av1_svc_update_buffer_slot_refreshed(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  const unsigned int current_frame =
      cpi->ppi->use_svc ? svc->current_superframe
                        : cpi->common.current_frame.frame_number;
  // For any buffer slot that is refreshed, update it with
  // the spatial_layer_id and the current_superframe.
  if (cpi->common.current_frame.frame_type == KEY_FRAME) {
    // All slots are refreshed on KEY.
    for (unsigned int i = 0; i < REF_FRAMES; i++) {
      rtc_ref->buffer_time_index[i] = current_frame;
      rtc_ref->buffer_spatial_layer[i] = svc->spatial_layer_id;
    }
  } else if (rtc_ref->set_ref_frame_config) {
    for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
      const int ref_frame_map_idx = rtc_ref->ref_idx[i];
      if (rtc_ref->refresh[ref_frame_map_idx]) {
        rtc_ref->buffer_time_index[ref_frame_map_idx] = current_frame;
        rtc_ref->buffer_spatial_layer[ref_frame_map_idx] =
            svc->spatial_layer_id;
      }
    }
  }
}